

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

SQInteger __thiscall
SQTable::Next(SQTable *this,bool getweakrefs,SQObjectPtr *refpos,SQObjectPtr *outkey,
             SQObjectPtr *outval)

{
  SQObjectPtr *this_00;
  SQObjectPtr *in_RDX;
  byte in_SIL;
  long in_RDI;
  _HashNode *n;
  SQInteger idx;
  SQObjectPtr *in_stack_ffffffffffffffb8;
  SQTable *obj;
  SQUnsignedInteger local_38;
  
  local_38 = TranslateIndex(in_RDX);
  while( true ) {
    if (*(long *)(in_RDI + 0x48) <= (long)local_38) {
      return -1;
    }
    if (*(int *)(*(long *)(in_RDI + 0x40) + local_38 * 0x28 + 0x10) != 0x1000001) break;
    local_38 = local_38 + 1;
  }
  this_00 = (SQObjectPtr *)(*(long *)(in_RDI + 0x40) + local_38 * 0x28);
  ::SQObjectPtr::operator=(this_00,in_stack_ffffffffffffffb8);
  if ((in_SIL & 1) == 0) {
    if ((this_00->super_SQObject)._type == OT_WEAKREF) {
      obj = (SQTable *)((this_00->super_SQObject)._unVal.pString)->_next;
    }
    else {
      obj = (this_00->super_SQObject)._unVal.pTable;
    }
  }
  else {
    obj = (this_00->super_SQObject)._unVal.pTable;
  }
  ::SQObjectPtr::operator=(this_00,(SQObject *)obj);
  return local_38 + 1;
}

Assistant:

SQInteger SQTable::Next(bool getweakrefs,const SQObjectPtr &refpos, SQObjectPtr &outkey, SQObjectPtr &outval)
{
    SQInteger idx = (SQInteger)TranslateIndex(refpos);
    while (idx < _numofnodes) {
        if(sq_type(_nodes[idx].key) != OT_NULL) {
            //first found
            _HashNode &n = _nodes[idx];
            outkey = n.key;
            outval = getweakrefs?(SQObject)n.val:_realval(n.val);
            //return idx for the next iteration
            return ++idx;
        }
        ++idx;
    }
    //nothing to iterate anymore
    return -1;
}